

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliasedOutline
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  uint size;
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint8 *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  pbVar2 = EnsureSpace(this,ptr);
  size = (uint)s->_M_string_length;
  uVar7 = num << 3;
  uVar6 = size;
  if (uVar7 < 0x80) {
    *pbVar2 = (byte)uVar7 | 2;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar7 | 0x82;
    if (uVar7 < 0x4000) {
      pbVar2[1] = (byte)(uVar7 >> 7);
      pbVar2 = pbVar2 + 2;
    }
    else {
      pbVar2 = pbVar2 + 2;
      uVar7 = uVar7 >> 7;
      do {
        pbVar3 = pbVar2;
        pbVar3[-1] = (byte)uVar7 | 0x80;
        uVar5 = uVar7 >> 7;
        pbVar2 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar5;
      } while (bVar1);
      *pbVar3 = (byte)uVar5;
    }
  }
  while( true ) {
    if (uVar6 < 0x80) break;
    *pbVar2 = (byte)uVar6 | 0x80;
    uVar6 = uVar6 >> 7;
    pbVar2 = pbVar2 + 1;
  }
  *pbVar2 = (byte)uVar6;
  puVar4 = WriteRawMaybeAliased(this,(s->_M_dataplus)._M_p,size,pbVar2 + 1);
  return puVar4;
}

Assistant:

uint8* EpsCopyOutputStream::WriteStringMaybeAliasedOutline(uint32 num,
                                                           const std::string& s,
                                                           uint8* ptr) {
  ptr = EnsureSpace(ptr);
  uint32 size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRawMaybeAliased(s.data(), size, ptr);
}